

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream-reader.hh
# Opt level: O0

bool __thiscall tinyusdz::StreamReader::read8(StreamReader *this,uint64_t *ret)

{
  uint64_t local_28;
  uint64_t val;
  uint64_t *ret_local;
  StreamReader *this_local;
  
  if (this->length_ < this->idx_ + 8) {
    this_local._7_1_ = false;
  }
  else {
    local_28 = *(uint64_t *)(this->binary_ + this->idx_);
    val = (uint64_t)ret;
    if ((this->swap_endian_ & 1U) != 0) {
      ret_local = (uint64_t *)this;
      anon_unknown_28::swap8(&local_28);
    }
    *(uint64_t *)val = local_28;
    this->idx_ = this->idx_ + 8;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool read8(uint64_t *ret) const {
    if ((idx_ + 8) > length_) {
      return false;
    }

    uint64_t val;
    memcpy(&val, &binary_[idx_], sizeof(val));

    if (swap_endian_) {
      swap8(&val);
    }

    (*ret) = val;
    idx_ += 8;

    return true;
  }